

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedFixedWingAircraft.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedFixedWingAircraft::Decode
          (GED_EnhancedFixedWingAircraft *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  GED_EnhancedFixedWingAircraft *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x18) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  GED_BasicFixedWingAircraft::Decode(&this->super_GED_BasicFixedWingAircraft,local_18);
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui8SupFuelStatus);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8AirMaintStatus);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8PriAmmun);
  KDataStream::operator>>(pKVar2,&this->m_ui8SecAmmun);
  return;
}

Assistant:

void GED_EnhancedFixedWingAircraft::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GED_ENHANCED_FIXED_WING_AIRCRAFT_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    GED_BasicFixedWingAircraft::Decode( stream );

    stream >> m_ui8SupFuelStatus
           >> m_ui8AirMaintStatus
           >> m_ui8PriAmmun
           >> m_ui8SecAmmun;
}